

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

ReadBinaryOptions * GetOptions(void)

{
  char *pcVar1;
  pointer log_stream;
  ReadBinaryOptions *in_RDI;
  unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_> local_18;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  bool kFailOnCustomSectionError;
  bool kStopOnFirstError;
  bool kReadDebugNames;
  
  local_9 = 1;
  local_a = 1;
  local_b = 1;
  wabt::Features::EnableAll(&s_features);
  pcVar1 = getenv("WASM_API_DEBUG");
  if (pcVar1 != (char *)0x0) {
    wabt::FileStream::CreateStdout();
    std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::operator=
              (&s_log_stream,&local_18);
    std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::~unique_ptr
              (&local_18);
  }
  log_stream = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::get
                         (&s_log_stream);
  wabt::ReadBinaryOptions::ReadBinaryOptions
            (in_RDI,&s_features,&log_stream->super_Stream,true,true,true);
  return in_RDI;
}

Assistant:

static ReadBinaryOptions GetOptions() {
  const bool kReadDebugNames = true;
  const bool kStopOnFirstError = true;
  const bool kFailOnCustomSectionError = true;
  s_features.EnableAll();
  if (getenv("WASM_API_DEBUG") != nullptr) {
    s_log_stream = FileStream::CreateStdout();
  }
  return ReadBinaryOptions(s_features, s_log_stream.get(), kReadDebugNames,
                           kStopOnFirstError, kFailOnCustomSectionError);
}